

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O0

void __thiscall
foxxll::disk_block_allocator::deallocation_error
          (disk_block_allocator *this,uint64_t block_pos,uint64_t block_size,iterator *pred,
          iterator *succ)

{
  bool bVar1;
  Logger *pLVar2;
  pointer ppVar3;
  char (*local_cb0) [11];
  Logger local_c78;
  LoggerVoidify local_af9;
  Logger local_af8;
  LoggerVoidify local_979;
  _Self local_978;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_970;
  Logger local_968;
  LoggerVoidify local_7e9;
  _Self local_7e8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_7e0;
  Logger local_7d8;
  LoggerVoidify local_659;
  Logger local_658;
  LoggerVoidify local_4d9;
  _Self local_4d8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_4d0;
  Logger local_4c8;
  LoggerVoidify local_349;
  _Self local_348;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_340;
  Logger local_338;
  LoggerVoidify local_1bd [13];
  Logger local_1b0;
  LoggerVoidify local_31;
  iterator *local_30;
  iterator *succ_local;
  iterator *pred_local;
  uint64_t block_size_local;
  uint64_t block_pos_local;
  disk_block_allocator *this_local;
  
  local_30 = succ;
  succ_local = pred;
  pred_local = (iterator *)block_size;
  block_size_local = block_pos;
  block_pos_local = (uint64_t)this;
  tlx::Logger::Logger(&local_1b0);
  pLVar2 = tlx::Logger::operator<<(&local_1b0,(char (*) [29])"Error deallocating block at ");
  pLVar2 = tlx::Logger::operator<<(pLVar2,&block_size_local);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [7])0x1bf92b);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(unsigned_long *)&pred_local);
  tlx::LoggerVoidify::operator&(&local_31,pLVar2);
  tlx::Logger::~Logger(&local_1b0);
  tlx::Logger::Logger(&local_338);
  bVar1 = std::operator==(succ_local,local_30);
  if (bVar1) {
    local_cb0 = (char (*) [11])0x1bf6a8;
  }
  else {
    local_cb0 = (char (*) [11])0x1bf6b3;
  }
  pLVar2 = tlx::Logger::operator<<(&local_338,local_cb0);
  tlx::LoggerVoidify::operator&(local_1bd,pLVar2);
  tlx::Logger::~Logger(&local_338);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
  _Rb_tree_const_iterator(&local_340,succ_local);
  local_348._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::end(&this->free_space_);
  bVar1 = std::operator==(&local_340,&local_348);
  if (bVar1) {
    tlx::Logger::Logger(&local_4c8);
    pLVar2 = tlx::Logger::operator<<(&local_4c8,(char (*) [24])"pred==free_space_.end()");
    tlx::LoggerVoidify::operator&(&local_349,pLVar2);
    tlx::Logger::~Logger(&local_4c8);
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
    _Rb_tree_const_iterator(&local_4d0,succ_local);
    local_4d8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::begin(&this->free_space_);
    bVar1 = std::operator==(&local_4d0,&local_4d8);
    if (bVar1) {
      tlx::Logger::Logger(&local_658);
      pLVar2 = tlx::Logger::operator<<(&local_658,(char (*) [26])"pred==free_space_.begin()");
      tlx::LoggerVoidify::operator&(&local_4d9,pLVar2);
      tlx::Logger::~Logger(&local_658);
    }
    tlx::Logger::Logger(&local_7d8);
    pLVar2 = tlx::Logger::operator<<(&local_7d8,(char (*) [13])"pred: begin=");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (succ_local);
    pLVar2 = tlx::Logger::operator<<(pLVar2,&ppVar3->first);
    pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [7])" size=");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (succ_local);
    pLVar2 = tlx::Logger::operator<<(pLVar2,&ppVar3->second);
    tlx::LoggerVoidify::operator&(&local_659,pLVar2);
    tlx::Logger::~Logger(&local_7d8);
  }
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
  _Rb_tree_const_iterator(&local_7e0,local_30);
  local_7e8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::end(&this->free_space_);
  bVar1 = std::operator==(&local_7e0,&local_7e8);
  if (bVar1) {
    tlx::Logger::Logger(&local_968);
    pLVar2 = tlx::Logger::operator<<(&local_968,(char (*) [24])"succ==free_space_.end()");
    tlx::LoggerVoidify::operator&(&local_7e9,pLVar2);
    tlx::Logger::~Logger(&local_968);
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
    _Rb_tree_const_iterator(&local_970,local_30);
    local_978._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::begin(&this->free_space_);
    bVar1 = std::operator==(&local_970,&local_978);
    if (bVar1) {
      tlx::Logger::Logger(&local_af8);
      pLVar2 = tlx::Logger::operator<<(&local_af8,(char (*) [26])"succ==free_space_.begin()");
      tlx::LoggerVoidify::operator&(&local_979,pLVar2);
      tlx::Logger::~Logger(&local_af8);
    }
    tlx::Logger::Logger(&local_c78);
    pLVar2 = tlx::Logger::operator<<(&local_c78,(char (*) [13])"succ: begin=");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (local_30);
    pLVar2 = tlx::Logger::operator<<(pLVar2,&ppVar3->first);
    pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [7])" size=");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (local_30);
    pLVar2 = tlx::Logger::operator<<(pLVar2,&ppVar3->second);
    tlx::LoggerVoidify::operator&(&local_af9,pLVar2);
    tlx::Logger::~Logger(&local_c78);
  }
  dump(this);
  return;
}

Assistant:

void disk_block_allocator::deallocation_error(
    uint64_t block_pos, uint64_t block_size,
    const space_map_type::iterator& pred,
    const space_map_type::iterator& succ) const
{
    TLX_LOG1 << "Error deallocating block at " << block_pos << " size " << block_size;
    TLX_LOG1 << ((pred == succ) ? "pred==succ" : "pred!=succ");
    if (pred == free_space_.end()) {
        TLX_LOG1 << "pred==free_space_.end()";
    }
    else {
        if (pred == free_space_.begin())
            TLX_LOG1 << "pred==free_space_.begin()";
        TLX_LOG1 << "pred: begin=" << pred->first << " size=" << pred->second;
    }
    if (succ == free_space_.end()) {
        TLX_LOG1 << "succ==free_space_.end()";
    }
    else {
        if (succ == free_space_.begin())
            TLX_LOG1 << "succ==free_space_.begin()";
        TLX_LOG1 << "succ: begin=" << succ->first << " size=" << succ->second;
    }
    dump();
}